

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int printfConsumer(jx9_context *pCtx,char *zInput,int nLen,void *pUserData)

{
  jx9_int64 *pCounter;
  void *pUserData_local;
  int nLen_local;
  char *zInput_local;
  jx9_context *pCtx_local;
  
  jx9_context_output(pCtx,zInput,nLen);
  *(long *)pUserData = (long)nLen + *pUserData;
  return 0;
}

Assistant:

static int printfConsumer(jx9_context *pCtx, const char *zInput, int nLen, void *pUserData)
{
	jx9_int64 *pCounter = (jx9_int64 *)pUserData;
	/* Call the VM output consumer directly */
	jx9_context_output(pCtx, zInput, nLen);
	/* Increment counter */
	*pCounter += nLen;
	return JX9_OK;
}